

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O2

int coda_cdf_variable_add_attribute
              (coda_cdf_variable *type,char *real_name,coda_dynamic_type *attribute_type,
              int update_definition)

{
  long lVar1;
  int iVar2;
  coda_type_record *pcVar3;
  coda_mem_record *pcVar4;
  long lVar5;
  coda_dynamic_type **ppcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  
  if (type == (coda_cdf_variable *)0x0) {
    pcVar8 = "type argument is NULL (%s:%u)";
    uVar9 = 0x1ac;
LAB_0017eca9:
    coda_set_error(-100,pcVar8,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,uVar9);
    return -1;
  }
  if (real_name == (char *)0x0) {
    pcVar8 = "real_name argument is NULL (%s:%u)";
    uVar9 = 0x1b1;
    goto LAB_0017eca9;
  }
  if (attribute_type == (coda_dynamic_type *)0x0) {
    pcVar8 = "attribute_type argument is NULL (%s:%u)";
    uVar9 = 0x1b6;
    goto LAB_0017eca9;
  }
  pcVar4 = type->attributes;
  if (pcVar4 == (coda_mem_record *)0x0) {
    if (update_definition == 0) {
      pcVar8 = "type does not have an attribute with name \'%s\' (%s:%u)";
      iVar2 = -0x66;
      uVar9 = 0x1cf;
      goto LAB_0017ed58;
    }
    pcVar3 = type->definition->attributes;
    if (pcVar3 == (coda_type_record *)0x0) {
      pcVar3 = coda_type_record_new(type->definition->format);
      type->definition->attributes = pcVar3;
      if (pcVar3 == (coda_type_record *)0x0) {
        return -1;
      }
    }
    pcVar4 = coda_mem_record_new(pcVar3,(coda_dynamic_type *)0x0);
    type->attributes = pcVar4;
    if (pcVar4 == (coda_mem_record *)0x0) {
      return -1;
    }
    pcVar3 = pcVar4->definition;
  }
  else {
    if (pcVar4->backend != coda_backend_memory) {
      pcVar8 = "cannot add attribute (%s:%u)";
      uVar9 = 0x1d7;
      goto LAB_0017eca9;
    }
    pcVar3 = pcVar4->definition;
    if (type->definition->attributes != pcVar3) {
      __assert_fail("type->definition->attributes == type->attributes->definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                    ,0x1da,
                    "int coda_cdf_variable_add_attribute(coda_cdf_variable *, const char *, coda_dynamic_type *, int)"
                   );
    }
  }
  lVar5 = coda_hashtable_get_index_from_name(pcVar3->real_name_hash_data,real_name);
  if (update_definition == 0) {
    if (lVar5 < 0) {
      pcVar8 = "type does not have an attribute with name \'%s\' (%s:%u)";
      iVar2 = -0x66;
      uVar9 = 0x205;
    }
    else if (pcVar4->field_type[lVar5] == (coda_dynamic_type *)0x0) {
      if (pcVar4->definition->field[lVar5]->type == attribute_type->definition) goto LAB_0017ed64;
      pcVar8 = "trying to add attribute \'%s\' of incompatible type (%s:%u)";
      iVar2 = -100;
      uVar9 = 0x211;
    }
    else {
      pcVar8 = "attribute \'%s\' is already set (%s:%u)";
      iVar2 = -100;
      uVar9 = 0x20b;
    }
LAB_0017ed58:
    coda_set_error(iVar2,pcVar8,real_name,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,uVar9);
    return -1;
  }
  if ((lVar5 < 0) ||
     ((lVar7 = pcVar4->num_fields, lVar5 < lVar7 &&
      (pcVar4->field_type[lVar5] != (coda_dynamic_type *)0x0)))) {
    iVar2 = coda_type_record_create_field(pcVar4->definition,real_name,attribute_type->definition);
    if (iVar2 != 0) {
      return -1;
    }
    lVar7 = pcVar4->num_fields;
    lVar5 = pcVar4->definition->num_fields + -1;
  }
  lVar1 = pcVar4->definition->num_fields;
  if (lVar7 < lVar1) {
    ppcVar6 = (coda_dynamic_type **)realloc(pcVar4->field_type,lVar1 << 3);
    if (ppcVar6 == (coda_dynamic_type **)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     pcVar4->definition->num_fields << 3,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                     ,500);
      return -1;
    }
    pcVar4->field_type = ppcVar6;
    for (lVar7 = pcVar4->num_fields; lVar1 = pcVar4->definition->num_fields, lVar7 < lVar1;
        lVar7 = lVar7 + 1) {
      pcVar4->field_type[lVar7] = (coda_dynamic_type *)0x0;
    }
    pcVar4->num_fields = lVar1;
  }
LAB_0017ed64:
  pcVar4->field_type[lVar5] = attribute_type;
  return 0;
}

Assistant:

int coda_cdf_variable_add_attribute(coda_cdf_variable *type, const char *real_name, coda_dynamic_type *attribute_type,
                                    int update_definition)
{
    coda_mem_record *attributes;
    long index = -1;

    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (real_name == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "real_name argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (attribute_type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attribute_type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (type->attributes == NULL)
    {
        if (update_definition)
        {
            if (type->definition->attributes == NULL)
            {
                type->definition->attributes = coda_type_record_new(type->definition->format);
                if (type->definition->attributes == NULL)
                {
                    return -1;
                }
            }
            type->attributes = coda_mem_record_new(type->definition->attributes, NULL);
            if (type->attributes == NULL)
            {
                return -1;
            }
        }
        else
        {
            coda_set_error(CODA_ERROR_INVALID_NAME, "type does not have an attribute with name '%s' (%s:%u)", real_name,
                           __FILE__, __LINE__);
            return -1;
        }
    }
    else
    {
        if (type->attributes->backend != coda_backend_memory)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cannot add attribute (%s:%u)", __FILE__, __LINE__);
            return -1;
        }
        assert(type->definition->attributes == type->attributes->definition);
    }

    attributes = type->attributes;

    index = hashtable_get_index_from_name(attributes->definition->real_name_hash_data, real_name);
    if (update_definition)
    {
        if (index < 0 || (index < attributes->num_fields && attributes->field_type[index] != NULL))
        {
            if (coda_type_record_create_field(attributes->definition, real_name, attribute_type->definition) != 0)
            {
                return -1;
            }
            index = attributes->definition->num_fields - 1;
        }
        if (attributes->num_fields < attributes->definition->num_fields)
        {
            coda_dynamic_type **new_field_type;
            long i;

            new_field_type = realloc(attributes->field_type,
                                     attributes->definition->num_fields * sizeof(coda_dynamic_type *));
            if (new_field_type == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               attributes->definition->num_fields * sizeof(coda_dynamic_type *), __FILE__, __LINE__);

                return -1;
            }
            attributes->field_type = new_field_type;
            for (i = attributes->num_fields; i < attributes->definition->num_fields; i++)
            {
                attributes->field_type[i] = NULL;
            }
            attributes->num_fields = attributes->definition->num_fields;
        }
    }
    else
    {
        if (index < 0)
        {
            coda_set_error(CODA_ERROR_INVALID_NAME, "type does not have an attribute with name '%s' (%s:%u)", real_name,
                           __FILE__, __LINE__);
            return -1;
        }
        if (attributes->field_type[index] != NULL)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attribute '%s' is already set (%s:%u)", real_name, __FILE__,
                           __LINE__);
            return -1;
        }
        if (attributes->definition->field[index]->type != attribute_type->definition)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "trying to add attribute '%s' of incompatible type (%s:%u)",
                           real_name, __FILE__, __LINE__);
            return -1;
        }
    }
    attributes->field_type[index] = attribute_type;

    return 0;
}